

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::LoadDynamicProfileInfo(FunctionBody *this)

{
  uint sourceContextId;
  SourceDynamicProfileManager *this_00;
  bool bVar1;
  LocalFunctionId functionId;
  DynamicProfileInfo *ptr;
  
  this_00 = (((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
                m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceDynamicProfileManager).ptr;
  if (this_00 != (SourceDynamicProfileManager *)0x0) {
    ptr = SourceDynamicProfileManager::GetDynamicProfileInfo(this_00,this);
    Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::WriteBarrierSet(&this->dynamicProfileInfo,ptr);
    if ((this->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
      sourceContextId =
           ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
              m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
      functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01433318,DynamicProfilePhase,sourceContextId,
                                functionId);
      if (bVar1) {
        Output::Print(L"Loaded:");
        DynamicProfileInfo::Dump((this->dynamicProfileInfo).ptr,this,(ArenaAllocator *)0x0);
      }
    }
  }
  DynamicProfileMutator::Mutate(this);
  return;
}

Assistant:

void FunctionBody::LoadDynamicProfileInfo()
    {
        SourceDynamicProfileManager * sourceDynamicProfileManager = GetSourceContextInfo()->sourceDynamicProfileManager;
        if (sourceDynamicProfileManager != nullptr)
        {
            this->dynamicProfileInfo = sourceDynamicProfileManager->GetDynamicProfileInfo(this);
#if DBG_DUMP
            if(this->dynamicProfileInfo)
            {
                if (Configuration::Global.flags.Dump.IsEnabled(DynamicProfilePhase, this->GetSourceContextId(), this->GetLocalFunctionId()))
                {
                    Output::Print(_u("Loaded:"));
                    this->dynamicProfileInfo->Dump(this);
                }
            }
#endif
        }

#ifdef DYNAMIC_PROFILE_MUTATOR
        DynamicProfileMutator::Mutate(this);
#endif
    }